

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::clear_memo_foreach_action(search_private *priv)

{
  v_array<Search::action_cache> *pvVar1;
  v_array<Search::action_cache> **ppvVar2;
  v_array<Search::action_cache> **ppvVar3;
  ulong uVar4;
  
  ppvVar2 = (priv->memo_foreach_action)._begin;
  ppvVar3 = (priv->memo_foreach_action)._end;
  if (ppvVar3 != ppvVar2) {
    uVar4 = 0;
    do {
      pvVar1 = ppvVar2[uVar4];
      if (pvVar1 != (v_array<Search::action_cache> *)0x0) {
        if (pvVar1->_begin != (action_cache *)0x0) {
          free(pvVar1->_begin);
        }
        pvVar1->_begin = (action_cache *)0x0;
        pvVar1->_end = (action_cache *)0x0;
        pvVar1->end_array = (action_cache *)0x0;
        operator_delete((priv->memo_foreach_action)._begin[uVar4]);
        ppvVar2 = (priv->memo_foreach_action)._begin;
        ppvVar3 = (priv->memo_foreach_action)._end;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)ppvVar3 - (long)ppvVar2 >> 3));
  }
  v_array<v_array<Search::action_cache>_*>::clear(&priv->memo_foreach_action);
  return;
}

Assistant:

void clear_memo_foreach_action(search_private& priv)
{
  for (size_t i = 0; i < priv.memo_foreach_action.size(); i++)
    if (priv.memo_foreach_action[i])
    {
      priv.memo_foreach_action[i]->delete_v();
      delete priv.memo_foreach_action[i];
    }
  priv.memo_foreach_action.clear();
}